

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerReflection::execution_model_to_str_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this,ExecutionModel model)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "vert";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "tesc";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "tese";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "geom";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "frag";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "comp";
    pcVar1 = "";
    break;
  default:
    switch((int)this) {
    case 0x14c1:
      pcVar2 = "rgen";
      pcVar1 = "";
      break;
    case 0x14c2:
      pcVar2 = "rint";
      pcVar1 = "";
      break;
    case 0x14c3:
      pcVar2 = "rahit";
      pcVar1 = "";
      break;
    case 0x14c4:
      pcVar2 = "rchit";
      pcVar1 = "";
      break;
    case 0x14c5:
      pcVar2 = "rmiss";
      pcVar1 = "";
      break;
    case 0x14c6:
      pcVar2 = "rcall";
      pcVar1 = "";
      break;
    default:
      pcVar2 = "???";
      pcVar1 = "";
    }
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::execution_model_to_str(spv::ExecutionModel model)
{
	switch (model)
	{
	case ExecutionModelVertex:
		return "vert";
	case ExecutionModelTessellationControl:
		return "tesc";
	case ExecutionModelTessellationEvaluation:
		return "tese";
	case ExecutionModelGeometry:
		return "geom";
	case ExecutionModelFragment:
		return "frag";
	case ExecutionModelGLCompute:
		return "comp";
	case ExecutionModelRayGenerationNV:
		return "rgen";
	case ExecutionModelIntersectionNV:
		return "rint";
	case ExecutionModelAnyHitNV:
		return "rahit";
	case ExecutionModelClosestHitNV:
		return "rchit";
	case ExecutionModelMissNV:
		return "rmiss";
	case ExecutionModelCallableNV:
		return "rcall";
	default:
		return "???";
	}
}